

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

float rsg::ParenOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  float fVar2;
  float fVar3;
  
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    iVar1 = state->m_expressionDepth + 2;
    fVar3 = 0.05;
  }
  else {
    iVar1 = getConservativeValueExprDepth(state,valueRange);
    iVar1 = iVar1 + state->m_expressionDepth + 1;
    fVar3 = 1.0;
  }
  fVar2 = 0.0;
  if (iVar1 <= state->m_shaderParams->maxExpressionDepth) {
    fVar2 = fVar3;
  }
  return fVar2;
}

Assistant:

float ParenOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
		return state.getExpressionDepth() + 2 <= state.getShaderParameters().maxExpressionDepth ? unusedValueWeight : 0.0f;
	else
	{
		int requiredDepth = 1 + getConservativeValueExprDepth(state, valueRange);
		return state.getExpressionDepth() + requiredDepth <= state.getShaderParameters().maxExpressionDepth ? 1.0f : 0.0f;
	}
}